

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O0

void __thiscall
Equality_unitsNotEqualByUnitIdOnly_Test::~Equality_unitsNotEqualByUnitIdOnly_Test
          (Equality_unitsNotEqualByUnitIdOnly_Test *this)

{
  Equality_unitsNotEqualByUnitIdOnly_Test *this_local;
  
  ~Equality_unitsNotEqualByUnitIdOnly_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Equality, unitsNotEqualByUnitIdOnly)
{
    libcellml::UnitsPtr u1 = libcellml::Units::create("unitsA");
    libcellml::UnitsPtr u2 = libcellml::Units::create("unitsA");

    u1->addUnit("second");
    u2->addUnit("second");

    u1->setUnitId(0, "UnitsASecond");

    EXPECT_NE(u1, u2);
    EXPECT_FALSE(u1->equals(u2));
    EXPECT_FALSE(u2->equals(u1));
    EXPECT_TRUE(libcellml::Units::equivalent(u1, u2));
}